

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

long mi_option_get(mi_option_t option)

{
  if (mi_option_generic_collect < option) {
    return 0;
  }
  if (options[option].init == UNINIT) {
    mi_option_init(options + option);
  }
  return options[option].value;
}

Assistant:

mi_decl_nodiscard long mi_option_get(mi_option_t option) {
  mi_assert(option >= 0 && option < _mi_option_last);
  if (option < 0 || option >= _mi_option_last) return 0;
  mi_option_desc_t* desc = &options[option];
  mi_assert(desc->option == option);  // index should match the option
  if mi_unlikely(desc->init == UNINIT) {
    mi_option_init(desc);
  }